

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O1

bool __thiscall
deqp::gls::FboUtil::ValidStatusCodes::isErrorCodeValid(ValidStatusCodes *this,GLenum errorCode)

{
  int iVar1;
  int iVar2;
  pointer pRVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  
  if (errorCode == 0) {
    bVar6 = (this->m_errorCodes).
            super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (this->m_errorCodes).
            super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    pRVar3 = (this->m_errorCodes).
             super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar2 = (int)((ulong)((long)(this->m_errorCodes).
                                super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3) >> 3);
    iVar4 = iVar2 * -0x49249249;
    bVar6 = 0 < iVar4;
    if ((0 < iVar4) && (pRVar3->errorCode != errorCode)) {
      iVar1 = 1;
      do {
        iVar5 = iVar1;
        pRVar3 = pRVar3 + 1;
        if (iVar4 == iVar5) break;
        iVar1 = iVar5 + 1;
      } while (pRVar3->errorCode != errorCode);
      return SBORROW4(iVar5,iVar4) != iVar5 + iVar2 * 0x49249249 < 0;
    }
  }
  return bVar6;
}

Assistant:

bool ValidStatusCodes::isErrorCodeValid (glw::GLenum errorCode) const
{
	if (errorCode == GL_NO_ERROR)
		return m_errorCodes.empty();
	else
	{
		// rule violation exists?
		for (int ndx = 0; ndx < (int)m_errorCodes.size(); ++ndx)
		{
			if (m_errorCodes[ndx].errorCode == errorCode)
				return true;
		}
		return false;
	}
}